

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

AssignmentStatement * __thiscall Parser::assignStmt(Parser *this,ExprNode *id)

{
  ExprNode *pEVar1;
  ExprNode *rhsExpr;
  AssignmentStatement *this_00;
  Testlist *testlist;
  undefined8 extraout_RAX;
  string *this_01;
  Token openBrace;
  allocator<char> local_1e9;
  Token local_1e8;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined1 local_52;
  
  Tokenizer::getToken((Token *)&stack0xffffffffffffff68,this->tokenizer);
  if (local_52 == '=') {
    Tokenizer::getToken(&local_1e8,this->tokenizer);
    Token::operator=((Token *)&stack0xffffffffffffff68,&local_1e8);
    Token::~Token(&local_1e8);
    if (local_52 == '[') {
      testlist = arrayInit(this);
      this_00 = (AssignmentStatement *)operator_new(0xf0);
      ExprNode::token(&local_1e8,id);
      std::__cxx11::string::string((string *)&local_158,(string *)&local_1e8);
      AssignmentStatement::AssignmentStatement(this_00,&local_158,testlist);
      this_01 = &local_158;
    }
    else {
      Tokenizer::ungetToken(this->tokenizer);
      pEVar1 = exprOrTest(this);
      this_00 = (AssignmentStatement *)operator_new(0xf0);
      ExprNode::token(&local_1e8,id);
      std::__cxx11::string::string((string *)&local_138,(string *)&local_1e8);
      AssignmentStatement::AssignmentStatement(this_00,&local_138,pEVar1);
      this_01 = &local_138;
    }
  }
  else {
    if (local_52 != '[') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Parser::assignStmt",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Expected an equal sign, instead got",&local_1e9);
      die(this,&local_b8,&local_d8,(Token *)&stack0xffffffffffffff68);
LAB_00105d01:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Parser::assignStmt",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Expected an equal sign, instead got",&local_1e9);
      die(this,&local_f8,&local_118,(Token *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      Token::~Token((Token *)&stack0xffffffffffffff68);
      _Unwind_Resume(extraout_RAX);
    }
    Tokenizer::ungetToken(this->tokenizer);
    pEVar1 = sub(this);
    Tokenizer::getToken(&local_1e8,this->tokenizer);
    Token::operator=((Token *)&stack0xffffffffffffff68,&local_1e8);
    Token::~Token(&local_1e8);
    if (local_52 != '=') goto LAB_00105d01;
    Tokenizer::getToken(&local_1e8,this->tokenizer);
    this_00 = (AssignmentStatement *)&stack0xffffffffffffff68;
    Token::operator=((Token *)this_00,&local_1e8);
    Token::~Token(&local_1e8);
    if (local_52 == '[') goto LAB_00105c8e;
    Tokenizer::ungetToken(this->tokenizer);
    rhsExpr = exprOrTest(this);
    this_00 = (AssignmentStatement *)operator_new(0xf0);
    ExprNode::token(&local_1e8,id);
    std::__cxx11::string::string((string *)&local_178,(string *)&local_1e8);
    AssignmentStatement::AssignmentStatement(this_00,&local_178,pEVar1,rhsExpr);
    this_01 = &local_178;
  }
  std::__cxx11::string::~string((string *)this_01);
  Token::~Token(&local_1e8);
LAB_00105c8e:
  Token::~Token((Token *)&stack0xffffffffffffff68);
  return this_00;
}

Assistant:

AssignmentStatement *Parser::assignStmt(ExprNode *id) {

    //assign_stmt: ID '=' test

//    Token varName = tokenizer.getToken();
//    if (!varName.isName())
//        die("Parser::assignStmt", "Expected a name token, instead got", varName);
    Token openBrace = tokenizer.getToken();
    if (!openBrace.isOpenBrace()) { // ID =
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) {
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), rightHandSideExpr);
        } else{
            Testlist *arrayTestlist = arrayInit();
//            Token closeBrace = tokenizer.getToken();
//            if (!closeBrace.isCloseBrace())
//                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
            return new AssignmentStatement(id->token().getName(), arrayTestlist);
        }
    }else{ //  ID[...] =
        tokenizer.ungetToken();
        ExprNode *subscription = sub();
        openBrace = tokenizer.getToken();
        if (!openBrace.isAssignmentOperator())
            die("Parser::assignStmt", "Expected an equal sign, instead got", openBrace);
        openBrace = tokenizer.getToken();
        if (!openBrace.isOpenBrace()) { // test
            tokenizer.ungetToken();
            ExprNode *rightHandSideExpr = test();
            return new AssignmentStatement(id->token().getName(), subscription, rightHandSideExpr);
        }
//        } else{ // [...]
//            Testlist *arrayTestlist = arrayInit();
////            Token closeBrace = tokenizer.getToken();
////            if (!closeBrace.isCloseBrace())
////                die("Parser::assignStmt", "Expected an ] sign, instead got", closeBrace);
//            return new AssignmentStatement(id->token().getName(),subscription, arrayTestlist);
//        }
    }





}